

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

bool __thiscall
dg::GenericCallGraph<const_llvm::Function_*>::FuncNode::addCall(FuncNode *this,FuncNode *x)

{
  pointer *pppFVar1;
  FuncNode **ppFVar2;
  iterator iVar3;
  pointer ppFVar4;
  __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
  _Var5;
  __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
  _Var6;
  FuncNode *local_30;
  FuncNode *local_28;
  
  ppFVar2 = (this->_calls).
            super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_30 = x;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::GenericCallGraph<llvm::Function_const*>::FuncNode::_contains<std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>(dg::GenericCallGraph<llvm::Function_const*>::FuncNode_const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>const&)const::_lambda(dg::GenericCallGraph<llvm::Function_const*>::FuncNode*)_1_>>
                    ((this->_calls).
                     super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,ppFVar2,x);
  if (_Var5._M_current == ppFVar2) {
    iVar3._M_current =
         (this->_calls).
         super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->_calls).
        super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>
      ::_M_realloc_insert<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*const&>
                ((vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>
                  *)&this->_calls,iVar3,&local_30);
    }
    else {
      *iVar3._M_current = local_30;
      pppFVar1 = &(this->_calls).
                  super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    ppFVar4 = (local_30->_callers).
              super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::GenericCallGraph<llvm::Function_const*>::FuncNode::_contains<std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>>(dg::GenericCallGraph<llvm::Function_const*>::FuncNode_const*,std::vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>const&)const::_lambda(dg::GenericCallGraph<llvm::Function_const*>::FuncNode*)_1_>>
                      ((local_30->_callers).
                       super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,ppFVar4,this);
    if (_Var6._M_current == ppFVar4) {
      iVar3._M_current =
           (local_30->_callers).
           super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (local_30->_callers).
          super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_28 = this;
        std::
        vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>
        ::_M_realloc_insert<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>
                  ((vector<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*,std::allocator<dg::GenericCallGraph<llvm::Function_const*>::FuncNode*>>
                    *)&local_30->_callers,iVar3,&local_28);
      }
      else {
        *iVar3._M_current = this;
        pppFVar1 = &(local_30->_callers).
                    super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
    }
  }
  return _Var5._M_current == ppFVar2;
}

Assistant:

bool addCall(FuncNode *x) {
            if (calls(x))
                return false;
            _calls.push_back(x);
            if (!x->isCalledBy(this))
                x->_callers.push_back(this);
            return true;
        }